

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  Curl_easy *data_00;
  CURLcode CVar1;
  CURLcode result;
  Curl_easy *data;
  size_t len_local;
  char *ptr_local;
  int type_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  data = (Curl_easy *)len;
  if (len == 0) {
    data = (Curl_easy *)strlen(ptr);
  }
  if ((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
     ((conn->proto).ftpc.transfertype == 'A')) {
    data = (Curl_easy *)convert_lineends(data_00,ptr,(size_t)data);
  }
  CVar1 = Curl_client_chop_write(conn,type,ptr,(size_t)data);
  return CVar1;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return Curl_client_chop_write(conn, type, ptr, len);
}